

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

void __thiscall xatlas::internal::segment::CostQueue::push(CostQueue *this,float cost,uint32_t face)

{
  Array<xatlas::internal::segment::CostQueue::Pair> *this_00;
  uint32_t uVar1;
  Pair *pPVar2;
  uint32_t index;
  uint32_t index_00;
  float fVar3;
  Pair p;
  float local_28;
  uint32_t local_24;
  
  this_00 = &this->m_pairs;
  local_28 = cost;
  local_24 = face;
  if (((this->m_pairs).m_base.size == 0) || (fVar3 = peekCost(this), cost < fVar3)) {
    ArrayBase::push_back(&this_00->m_base,(uint8_t *)&local_28);
  }
  else {
    uVar1 = (this->m_pairs).m_base.size;
    index_00 = 0;
    while ((index = uVar1, uVar1 != index_00 &&
           (pPVar2 = Array<xatlas::internal::segment::CostQueue::Pair>::operator[](this_00,index_00)
           , index = index_00, cost < pPVar2->cost || cost == pPVar2->cost))) {
      index_00 = index_00 + 1;
    }
    ArrayBase::insertAt(&this_00->m_base,index,(uint8_t *)&local_28);
    if (this->m_maxSize < (this->m_pairs).m_base.size) {
      ArrayBase::removeAt(&this_00->m_base,0);
    }
  }
  return;
}

Assistant:

void push(float cost, uint32_t face)
	{
		const Pair p = { cost, face };
		if (m_pairs.isEmpty() || cost < peekCost())
			m_pairs.push_back(p);
		else {
			uint32_t i = 0;
			const uint32_t count = m_pairs.size();
			for (; i < count; i++) {
				if (m_pairs[i].cost < cost)
					break;
			}
			m_pairs.insertAt(i, p);
			if (m_pairs.size() > m_maxSize)
				m_pairs.removeAt(0);
		}
	}